

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t set_timefilter_date(archive_match *a,wchar_t timetype,char *datestr)

{
  time_t mtime_sec;
  time_t t;
  char *datestr_local;
  wchar_t timetype_local;
  archive_match *a_local;
  
  if ((datestr == (char *)0x0) || (*datestr == '\0')) {
    archive_set_error(&a->archive,0x16,"date is empty");
    a_local._4_4_ = L'\xffffffe7';
  }
  else {
    mtime_sec = __archive_get_date(a->now,datestr);
    if (mtime_sec == -1) {
      archive_set_error(&a->archive,0x16,"invalid date string");
      a_local._4_4_ = L'\xffffffe7';
    }
    else {
      a_local._4_4_ = set_timefilter(a,timetype,mtime_sec,0,mtime_sec,0);
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
set_timefilter_date(struct archive_match *a, int timetype, const char *datestr)
{
	time_t t;

	if (datestr == NULL || *datestr == '\0') {
		archive_set_error(&(a->archive), EINVAL, "date is empty");
		return (ARCHIVE_FAILED);
	}
	t = get_date(a->now, datestr);
	if (t == (time_t)-1) {
		archive_set_error(&(a->archive), EINVAL, "invalid date string");
		return (ARCHIVE_FAILED);
	}
	return set_timefilter(a, timetype, t, 0, t, 0);
}